

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CGL::GLScene::Mesh::split_selected_edge(Mesh *this)

{
  HalfedgeElement *pHVar1;
  long lVar2;
  
  pHVar1 = (this->selectedFeature).element;
  if (pHVar1 != (HalfedgeElement *)0x0) {
    lVar2 = __dynamic_cast(pHVar1,&HalfedgeElement::typeinfo,&Edge::typeinfo,0);
    if (lVar2 != 0) {
      HalfedgeMesh::splitEdge(&this->mesh,*(_List_node_base **)(*(long *)(lVar2 + 0x80) + 0x30));
      (*(this->super_SceneObject)._vptr_SceneObject[8])(this);
      return;
    }
  }
  return;
}

Assistant:

void Mesh::split_selected_edge() {
  HalfedgeElement *element = selectedFeature.element;
  if (element == nullptr) return;
  Edge *edge = element->getEdge();
  if (edge == nullptr) return;
  mesh.splitEdge(edge->halfedge()->edge());
  invalidate_selection();
}